

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenTrySetBody(BinaryenExpressionRef expr,BinaryenExpressionRef bodyExpr)

{
  bool bVar1;
  Expression *expression;
  BinaryenExpressionRef bodyExpr_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::Try>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<Try>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xe65,"void BinaryenTrySetBody(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (bodyExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 2) = bodyExpr;
    return;
  }
  __assert_fail("bodyExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xe66,"void BinaryenTrySetBody(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenTrySetBody(BinaryenExpressionRef expr,
                        BinaryenExpressionRef bodyExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Try>());
  assert(bodyExpr);
  static_cast<Try*>(expression)->body = (Expression*)bodyExpr;
}